

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,char **err)

{
  pointer puVar1;
  pointer puVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long *plVar7;
  size_t i;
  ulong uVar8;
  allocator_type local_71;
  EXRImage *local_70;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  chunk_offset_table_list;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offset_table;
  
  if ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) {
    iVar6 = -3;
    if (err != (char **)0x0) {
      pcVar3 = "Invalid argument.";
LAB_00125af6:
      iVar6 = -3;
      *err = pcVar3;
    }
  }
  else {
    uVar8 = (ulong)num_parts;
    lVar5 = 0;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      if ((ulong)exr_headers[uVar4]->header_len == 0) {
        if (err == (char **)0x0) {
          return -3;
        }
        pcVar3 = "EXRHeader is not initialized.";
        goto LAB_00125af6;
      }
      lVar5 = lVar5 + (ulong)exr_headers[uVar4]->header_len;
    }
    plVar7 = (long *)(memory + lVar5 + 9);
    chunk_offset_table_list.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = exr_images;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 &offset_table.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>,
                 (long)exr_headers[uVar4]->chunk_count,&local_71);
      for (lVar5 = 0;
          (long)offset_table.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)offset_table.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
        offset_table.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar5] = *plVar7 + 4;
        plVar7 = plVar7 + 1;
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back(&chunk_offset_table_list,
                  (value_type *)
                  &offset_table.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                (&offset_table.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
    }
    iVar6 = 0;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      puVar2 = chunk_offset_table_list.
               super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      while ((long)chunk_offset_table_list.
                   super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3 != lVar5) {
        puVar1 = puVar2 + lVar5;
        lVar5 = lVar5 + 1;
        if (uVar4 != *(uint *)(memory + (*puVar1 - 4))) {
          iVar6 = -4;
          goto LAB_00125afe;
        }
      }
      tinyexr::DecodeChunk
                (local_70 + uVar4,exr_headers[uVar4],
                 chunk_offset_table_list.
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4,memory);
    }
LAB_00125afe:
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&chunk_offset_table_list);
  }
  return iVar6;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      if (err) {
        (*err) = "EXRHeader is not initialized.";
      }
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<std::vector<unsigned long long> > chunk_offset_table_list;
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> offset_table(
        static_cast<size_t>(exr_headers[i]->chunk_count));

    for (size_t c = 0; c < offset_table.size(); c++) {
      unsigned long long offset;
      memcpy(&offset, marker, 8);
      tinyexr::swap8(&offset);

      offset_table[c] = offset + 4;  // +4 to skip 'part number'
      marker += 8;
    }

    chunk_offset_table_list.push_back(offset_table);
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> &offset_table = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (size_t c = 0; c < offset_table.size(); c++) {
      const unsigned char *part_number_addr =
          memory + offset_table[c] - 4;  // -4 to move to 'part number' field.
      unsigned int part_no;
      memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
      tinyexr::swap4(&part_no);

      if (part_no != i) {
        assert(0);
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }

    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_table,
                                   memory);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}